

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O1

void __thiscall icu_63::TailoredSet::comparePrefixes(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  UErrorCode *errorCode;
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  byte bVar4;
  ushort uVar5;
  char16_t *srcChars;
  int iVar6;
  int32_t length;
  int srcStart;
  int srcLength;
  UnicodeString *this_00;
  UnicodeString *pfx;
  Iterator basePrefixes;
  Iterator prefixes;
  UnicodeString none;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  UChar *local_180;
  UChar *local_170;
  Iterator local_160;
  Iterator local_e8;
  UnicodeString local_70;
  
  errorCode = &this->errorCode;
  local_188.p_ = p;
  UCharsTrie::Iterator::Iterator(&local_e8,&local_188,0,errorCode);
  local_170 = local_188.p_;
  local_190.p_ = q;
  UCharsTrie::Iterator::Iterator(&local_160,&local_190,0,errorCode);
  local_180 = local_190.p_;
  UnicodeString::UnicodeString(&local_70,L'\xffff');
  do {
    this_00 = (UnicodeString *)0x0;
    pfx = (UnicodeString *)0x0;
    while( true ) {
      while( true ) {
        if (this_00 == (UnicodeString *)0x0) {
          UVar3 = UCharsTrie::Iterator::next(&local_e8,errorCode);
          this_00 = &local_70;
          if (UVar3 != '\0') {
            this_00 = &local_e8.str_;
          }
        }
        if (pfx == (UnicodeString *)0x0) {
          UVar3 = UCharsTrie::Iterator::next(&local_160,errorCode);
          pfx = &local_70;
          if (UVar3 != '\0') {
            pfx = &local_160.str_;
          }
        }
        if ((this_00 == &local_70) && (pfx == &local_70)) {
          UnicodeString::~UnicodeString(&local_70);
          UCharsTrie::Iterator::~Iterator(&local_160);
          UCharsTrie::Iterator::~Iterator(&local_e8);
          return;
        }
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        uVar2 = (pfx->fUnion).fStackFields.fLengthAndFlags;
        if ((uVar2 & 1) == 0) {
          if ((short)uVar2 < 0) {
            iVar6 = (pfx->fUnion).fFields.fLength;
          }
          else {
            iVar6 = (int)(short)uVar2 >> 5;
          }
          srcStart = iVar6;
          if (-1 < iVar6) {
            srcStart = 0;
          }
          srcLength = iVar6 - srcStart;
          if (iVar6 <= iVar6 - srcStart) {
            srcLength = iVar6;
          }
          if (iVar6 < 0) {
            srcLength = 0;
          }
          if (sVar1 < 0) {
            length = (this_00->fUnion).fFields.fLength;
          }
          else {
            length = (int)sVar1 >> 5;
          }
          if ((uVar2 & 2) == 0) {
            srcChars = (pfx->fUnion).fFields.fArray;
          }
          else {
            srcChars = (pfx->fUnion).fStackFields.fBuffer;
          }
          bVar4 = UnicodeString::doCompare(this_00,0,length,srcChars,srcStart,srcLength);
        }
        else {
          bVar4 = ~(byte)sVar1 & 1;
        }
        if (-1 < (char)bVar4) break;
        addPrefix(this,this->data,this_00,c,local_e8.value_);
        this_00 = (UnicodeString *)0x0;
      }
      if (bVar4 == 0) break;
      addPrefix(this,this->baseData,pfx,c,local_160.value_);
      pfx = (UnicodeString *)0x0;
    }
    setPrefix(this,this_00);
    compare(this,c,local_e8.value_,local_160.value_);
    uVar2 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
    uVar5 = uVar2 & 0x1e;
    if ((uVar2 & 1) != 0) {
      uVar5 = 2;
    }
    (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags = uVar5;
  } while( true );
}

Assistant:

void
TailoredSet::comparePrefixes(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over prefixes of both tables.
    UCharsTrie::Iterator prefixes(p, 0, errorCode);
    UCharsTrie::Iterator basePrefixes(q, 0, errorCode);
    const UnicodeString *tp = NULL;  // Tailoring prefix.
    const UnicodeString *bp = NULL;  // Base prefix.
    // Use a string with a U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in prefixes.
    UnicodeString none((UChar)0xffff);
    for(;;) {
        if(tp == NULL) {
            if(prefixes.next(errorCode)) {
                tp = &prefixes.getString();
            } else {
                tp = &none;
            }
        }
        if(bp == NULL) {
            if(basePrefixes.next(errorCode)) {
                bp = &basePrefixes.getString();
            } else {
                bp = &none;
            }
        }
        if(tp == &none && bp == &none) { break; }
        int32_t cmp = tp->compare(*bp);
        if(cmp < 0) {
            // tp occurs in the tailoring but not in the base.
            addPrefix(data, *tp, c, (uint32_t)prefixes.getValue());
            tp = NULL;
        } else if(cmp > 0) {
            // bp occurs in the base but not in the tailoring.
            addPrefix(baseData, *bp, c, (uint32_t)basePrefixes.getValue());
            bp = NULL;
        } else {
            setPrefix(*tp);
            compare(c, (uint32_t)prefixes.getValue(), (uint32_t)basePrefixes.getValue());
            resetPrefix();
            tp = NULL;
            bp = NULL;
        }
    }
}